

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

void MIR_gen_set_debug_level(MIR_context_t ctx,int level)

{
  if (ctx->gen_ctx != (gen_ctx *)0x0) {
    ctx->gen_ctx->debug_level = level;
    return;
  }
  fwrite("Calling MIR_gen_set_debug_level before MIR_gen_init -- good bye\n",0x40,1,_stderr);
  exit(1);
}

Assistant:

void MIR_gen_set_debug_level (MIR_context_t ctx, int level) {
#if !MIR_NO_GEN_DEBUG
  gen_ctx_t gen_ctx = *gen_ctx_loc (ctx);
  if (gen_ctx == NULL) {
    fprintf (stderr, "Calling MIR_gen_set_debug_level before MIR_gen_init -- good bye\n");
    exit (1);
  }
  debug_level = level;
#endif
}